

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

string * __thiscall
pbrt::CameraHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraHandle *this)

{
  ulong uVar1;
  PerspectiveCamera *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  this_00 = (PerspectiveCamera *)(uVar1 & 0xffffffffffff);
  if (this_00 == (PerspectiveCamera *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else if ((ushort)(uVar1 >> 0x30) < 3) {
    if ((uVar1 & 0x3000000000000) == 0x2000000000000) {
      OrthographicCamera::ToString_abi_cxx11_(__return_storage_ptr__,(OrthographicCamera *)this_00);
    }
    else {
      PerspectiveCamera::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
  }
  else if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
    SphericalCamera::ToString_abi_cxx11_(__return_storage_ptr__,(SphericalCamera *)this_00);
  }
  else {
    RealisticCamera::ToString_abi_cxx11_(__return_storage_ptr__,(RealisticCamera *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CameraHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}